

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int extension_bitmap_testandset(st_ptls_extension_bitmap_t *bitmap,int hstype,uint16_t extid)

{
  int iVar1;
  int iVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  uint uVar4;
  
  iVar1 = 1;
  iVar2 = (int)CONCAT62(in_register_00000012,extid);
  if (iVar2 < 0x29) {
    uVar4 = 0x204;
    if (iVar2 < 0xd) {
      if (iVar2 == 0) {
        uVar3 = 1;
      }
      else if (iVar2 == 5) {
        uVar3 = 2;
        uVar4 = 0x5004;
      }
      else {
        if (iVar2 != 10) {
          return 1;
        }
        uVar3 = 4;
      }
    }
    else if (iVar2 < 0x14) {
      if (iVar2 == 0xd) {
        uVar3 = 8;
LAB_001258cf:
        uVar4 = 0x4004;
      }
      else {
        if (iVar2 != 0x10) {
          return 1;
        }
        uVar3 = 0x10;
      }
    }
    else {
      if (iVar2 != 0x14) {
        if (iVar2 != 0x1b) {
          return 1;
        }
        uVar3 = 0x1000;
        goto LAB_001258cf;
      }
      uVar3 = 0x20;
    }
    goto LAB_001258d5;
  }
  switch(iVar2) {
  case 0x29:
    uVar3 = 0x80;
    uVar4 = 0xc;
    break;
  case 0x2a:
    uVar3 = 0x200;
    uVar4 = 0x224;
    break;
  case 0x2b:
    uVar3 = 0x800;
    goto LAB_001258b4;
  case 0x2c:
    uVar3 = 0x400;
    uVar4 = 5;
    break;
  case 0x2d:
    uVar3 = 0x100;
    uVar4 = 4;
    break;
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
    goto switchD_001257f2_caseD_2e;
  case 0x33:
    uVar3 = 0x40;
LAB_001258b4:
    uVar4 = 0xd;
    break;
  default:
    if (iVar2 == 0xfe0d) {
      uVar3 = 0x2000;
      uVar4 = 0x205;
    }
    else {
      if (iVar2 != 0xfd00) {
        return 1;
      }
      uVar3 = 0x4000;
      uVar4 = 0;
    }
  }
LAB_001258d5:
  iVar1 = 0;
  if (((uVar4 & (uint)(1L << ((char)hstype + 1U & 0x3f))) != 0) &&
     (((uint)bitmap->bits & (uint)uVar3) == 0)) {
    bitmap->bits = bitmap->bits | uVar3;
    return 1;
  }
switchD_001257f2_caseD_2e:
  return iVar1;
}

Assistant:

static int extension_bitmap_testandset(struct st_ptls_extension_bitmap_t *bitmap, int hstype, uint16_t extid)
{
#define HSTYPE_TO_BIT(hstype) ((uint64_t)1 << ((hstype) + 1)) /* min(hstype) is -1 (PSEUDO_HRR) */
#define DEFINE_BIT(abbrev, hstype) static const uint64_t abbrev = HSTYPE_TO_BIT(PTLS_HANDSHAKE_TYPE_##hstype)
#define EXT(candext, allowed_bits)                                                                                                 \
    do {                                                                                                                           \
        if (PTLS_UNLIKELY(extid == PTLS_EXTENSION_TYPE_##candext)) {                                                               \
            allowed_hs_bits = allowed_bits;                                                                                        \
            goto Found;                                                                                                            \
        }                                                                                                                          \
        ext_bitmap_mask <<= 1;                                                                                                     \
    } while (0)

    DEFINE_BIT(CH, CLIENT_HELLO);
    DEFINE_BIT(SH, SERVER_HELLO);
    DEFINE_BIT(HRR, PSEUDO_HRR);
    DEFINE_BIT(EE, ENCRYPTED_EXTENSIONS);
    DEFINE_BIT(CR, CERTIFICATE_REQUEST);
    DEFINE_BIT(CT, CERTIFICATE);
    DEFINE_BIT(NST, NEW_SESSION_TICKET);

    uint64_t allowed_hs_bits, ext_bitmap_mask = 1;

    /* clang-format off */
    /* RFC 8446 section 4.2: "The table below indicates the messages where a given extension may appear... If an implementation
     * receives an extension which it recognizes and which is not specified for the message in which it appears, it MUST abort the
     * handshake with an "illegal_parameter" alert.
     *
     * +-------------------------+---------------+
     * +        Extension        |    Allowed    |
     * +-------------------------+---------------+ */
    EXT( SERVER_NAME             , CH + EE       );
    EXT( STATUS_REQUEST          , CH + CR + CT  );
    EXT( SUPPORTED_GROUPS        , CH + EE       );
    EXT( SIGNATURE_ALGORITHMS    , CH + CR       );
    EXT( ALPN                    , CH + EE       );
    EXT( SERVER_CERTIFICATE_TYPE , CH + EE       );
    EXT( KEY_SHARE               , CH + SH + HRR );
    EXT( PRE_SHARED_KEY          , CH + SH       );
    EXT( PSK_KEY_EXCHANGE_MODES  , CH            );
    EXT( EARLY_DATA              , CH + EE + NST );
    EXT( COOKIE                  , CH + HRR      );
    EXT( SUPPORTED_VERSIONS      , CH + SH + HRR );
    EXT( COMPRESS_CERTIFICATE    , CH + CR       ); /* from RFC 8879 */
    EXT( ENCRYPTED_CLIENT_HELLO  , CH + HRR + EE ); /* from draft-ietf-tls-esni-15 */
    EXT( ECH_OUTER_EXTENSIONS    , 0             );
    /* +-----------------------------------------+ */
    /* clang-format on */

    return 1;

Found:
    if ((allowed_hs_bits & HSTYPE_TO_BIT(hstype)) == 0)
        return 0;
    if ((bitmap->bits & ext_bitmap_mask) != 0)
        return 0;
    bitmap->bits |= ext_bitmap_mask;
    return 1;

#undef HSTYPE_TO_BIT
#undef DEFINE_ABBREV
#undef EXT
}